

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::createMessageFromCommand(helics *this,ActionMessage *cmd)

{
  size_t size;
  baseType *pbVar1;
  void *__s;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  __s = operator_new(0x100);
  memset(__s,0,0x100);
  *(undefined8 *)((long)__s + 0x58) = 0x40;
  *(long *)((long)__s + 0x60) = (long)__s + 0x10;
  *(undefined8 *)((long)__s + 0x68) = 0;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)__s + 0x70);
  *(long *)((long)__s + 0x70) = (long)__s + 0x80;
  *(undefined8 *)((long)__s + 0x78) = 0;
  *(undefined1 *)((long)__s + 0x80) = 0;
  *(long *)((long)__s + 0x90) = (long)__s + 0xa0;
  *(undefined8 *)((long)__s + 0x98) = 0;
  *(undefined1 *)((long)__s + 0xa0) = 0;
  *(long *)((long)__s + 0xb0) = (long)__s + 0xc0;
  *(undefined8 *)((long)__s + 0xb8) = 0;
  *(undefined1 *)((long)__s + 0xc0) = 0;
  *(long *)((long)__s + 0xd0) = (long)__s + 0xe0;
  *(undefined8 *)((long)__s + 0xd8) = 0;
  *(undefined1 *)((long)__s + 0xe0) = 0;
  *(undefined4 *)((long)__s + 0xf0) = 0;
  *(undefined8 *)((long)__s + 0xf8) = 0;
  *(void **)this = __s;
  __str = (cmd->stringData).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  switch((long)(cmd->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__str >> 5) {
  case 0:
switchD_002e16aa_caseD_0:
    lVar2 = *(long *)this;
    if ((SmallBuffer *)(lVar2 + 0x10) != &cmd->payload) {
      size = (cmd->payload).bufferSize;
      SmallBuffer::reserve((SmallBuffer *)(lVar2 + 0x10),size);
      *(size_t *)(lVar2 + 0x50) = size;
      memcpy(*(void **)(lVar2 + 0x60),(cmd->payload).heap,(cmd->payload).bufferSize);
    }
    pbVar1 = *(baseType **)this;
    *pbVar1 = (cmd->actionTime).internalTimeCode;
    *(uint16_t *)(pbVar1 + 1) = cmd->flags;
    *(int32_t *)((long)pbVar1 + 0xc) = cmd->messageID;
    return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
  case 1:
    goto switchD_002e16aa_caseD_1;
  case 2:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,__str);
    __str = (cmd->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
    lVar2 = 0x90;
    break;
  case 3:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,__str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + 0x90),
               (cmd->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    __str = (cmd->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 2;
    lVar2 = 0xb0;
    break;
  default:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (this_00,__str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + 0x90),
               (cmd->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + 0xb0),
               (cmd->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2);
    __str = (cmd->stringData).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 3;
    lVar2 = 0xd0;
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (lVar2 + *(long *)this);
switchD_002e16aa_caseD_1:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,__str);
  goto switchD_002e16aa_caseD_0;
}

Assistant:

std::unique_ptr<Message> createMessageFromCommand(const ActionMessage& cmd)
{
    auto msg = std::make_unique<Message>();
    switch (cmd.stringData.size()) {
        case 0:
            break;
        case 1:
            msg->dest = cmd.stringData[0];
            break;
        case 2:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            break;
        case 3:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            msg->original_source = cmd.stringData[2];
            break;
        default:
            msg->dest = cmd.stringData[0];
            msg->source = cmd.stringData[1];
            msg->original_source = cmd.stringData[2];
            msg->original_dest = cmd.stringData[3];
            break;
    }
    msg->data = cmd.payload;
    msg->time = cmd.actionTime;
    msg->flags = cmd.flags;
    msg->messageID = cmd.messageID;

    return msg;
}